

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void write_ttymodes_to_packet(long bs,int ssh_version)

{
  uint uVar1;
  uint uVar2;
  uint opcode;
  uint val;
  uint i;
  int ssh_version_local;
  BinarySink *bs_local;
  
  for (opcode = 0; opcode < 0x102; opcode = opcode + 1) {
    if (((&stack0x00000008)[opcode] & 1) != 0) {
      uVar1 = *(uint *)(&stack0x0000010c + (ulong)opcode * 4);
      uVar2 = real_ttymode_opcode(opcode,ssh_version);
      BinarySink_put_byte(*(BinarySink **)(bs + 0x10),(uchar)uVar2);
      if (((ssh_version == 1) && (uVar2 != 0)) && (uVar2 < 0x80)) {
        BinarySink_put_byte(*(BinarySink **)(bs + 0x10),(uchar)uVar1);
      }
      else {
        BinarySink_put_uint32(*(BinarySink **)(bs + 0x10),(ulong)uVar1);
      }
    }
  }
  BinarySink_put_byte(*(BinarySink **)(bs + 0x10),'\0');
  return;
}

Assistant:

void write_ttymodes_to_packet(BinarySink *bs, int ssh_version,
                              struct ssh_ttymodes modes)
{
    unsigned i;

    for (i = 0; i < TTYMODE_LIMIT; i++) {
        if (modes.have_mode[i]) {
            unsigned val = modes.mode_val[i];
            unsigned opcode = real_ttymode_opcode(i, ssh_version);

            put_byte(bs, opcode);
            if (ssh_version == 1 && opcode >= 1 && opcode <= 127)
                put_byte(bs, val);
            else
                put_uint32(bs, val);
        }
    }

    put_byte(bs, TTYMODE_END_OF_LIST);
}